

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

wchar_t o_critical_melee(player *p,monster *monster,object *obj,uint32_t *msg_type)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  uint32_t uVar4;
  bool bVar5;
  o_critical_level *local_40;
  o_critical_level *this_l;
  wchar_t add_dice;
  wchar_t chance_den;
  wchar_t chance_num;
  wchar_t power;
  uint32_t *msg_type_local;
  object *obj_local;
  monster *monster_local;
  player *p_local;
  
  chance_den = chance_of_melee_hit_base(p,obj);
  _Var2 = is_debuffed(monster);
  if (_Var2) {
    chance_den = z_info->o_m_crit_debuff_toh + chance_den;
  }
  iVar3 = (chance_den * z_info->o_m_crit_power_toh_scl_num) / z_info->o_m_crit_power_toh_scl_den;
  iVar1 = z_info->o_m_crit_chance_power_scl_num;
  uVar4 = Rand_div(iVar3 * z_info->o_m_crit_chance_power_scl_den + z_info->o_m_crit_chance_add_den);
  if ((iVar3 * iVar1 < (int)(uVar4 + 1)) || (z_info->o_m_crit_level_head == (o_critical_level *)0x0)
     ) {
    this_l._0_4_ = L'\0';
    *msg_type = 0x55;
  }
  else {
    local_40 = z_info->o_m_crit_level_head;
    while( true ) {
      bVar5 = false;
      if (local_40->next != (o_critical_level *)0x0) {
        uVar4 = Rand_div(local_40->chance);
        bVar5 = uVar4 != 0;
      }
      if (!bVar5) break;
      local_40 = local_40->next;
    }
    this_l._0_4_ = local_40->added_dice;
    *msg_type = local_40->msgt;
  }
  return (wchar_t)this_l;
}

Assistant:

static int o_critical_melee(const struct player *p,
		const struct monster *monster,
		const struct object *obj, uint32_t *msg_type)
{
	int power = chance_of_melee_hit_base(p, obj);
	int chance_num, chance_den, add_dice;

	if (is_debuffed(monster)) {
		power += z_info->o_m_crit_debuff_toh;
	}
	/* Apply a rational scale factor. */
	power = (power * z_info->o_m_crit_power_toh_scl_num)
		/ z_info->o_m_crit_power_toh_scl_den;

	/* Test for critical hit:  chance is a * power / (b * power + c) */
	chance_num = power * z_info->o_m_crit_chance_power_scl_num;
	chance_den = power * z_info->o_m_crit_chance_power_scl_den
		+ z_info->o_m_crit_chance_add_den;
	if (randint1(chance_den) <= chance_num && z_info->o_m_crit_level_head) {
		/* Determine level of critical hit. */
		const struct o_critical_level *this_l =
			z_info->o_m_crit_level_head;

		while (this_l->next && !one_in_(this_l->chance)) {
			this_l = this_l->next;
		}
		add_dice = this_l->added_dice;
		*msg_type = this_l->msgt;
	} else {
		add_dice = 0;
		*msg_type = MSG_SHOOT_HIT;
	}

	return add_dice;
}